

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

int gmlc::utilities::stringOps::findCloseStringMatch
              (stringVector *testStrings,stringVector *inputStrings,string_match_type matchType)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer pbVar5;
  pointer pbVar6;
  long lVar7;
  size_type sVar8;
  char cVar9;
  size_type __size;
  char *__data;
  string_view input;
  string lct;
  string lcis;
  string nstr;
  stringVector lciStrings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string_match_type local_8c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  pointer local_68;
  pointer local_60;
  ulong local_58;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,inputStrings);
  for (pbVar5 = local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    sVar2 = pbVar5->_M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (pbVar5->_M_dataplus)._M_p;
      sVar8 = 0;
      do {
        cVar1 = pcVar3[sVar8];
        cVar9 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar9 = cVar1;
        }
        pcVar3[sVar8] = cVar9;
        sVar8 = sVar8 + 1;
      } while (sVar2 != sVar8);
    }
  }
  pbVar5 = (testStrings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (testStrings->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != local_68) {
    local_58 = (ulong)matchType;
    pbVar6 = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_8c = matchType;
    do {
      input._M_str = (char *)pbVar6;
      input._M_len = (size_t)(pbVar5->_M_dataplus)._M_p;
      convertToLowerCase_abi_cxx11_(&local_b0,(utilities *)pbVar5->_M_string_length,input);
      local_60 = pbVar5;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&local_f0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pbVar6 = (pointer)((ulong)((long)local_88.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_88.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5);
      if (0 < (int)pbVar6) {
        lVar7 = 0;
        do {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign(&local_d0,
                    local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar7);
          if (matchType < 4) {
            iVar4 = (*(code *)(&DAT_003f93c0 + *(int *)(&DAT_003f93c0 + local_58 * 4)))();
            return iVar4;
          }
          lVar7 = lVar7 + 1;
          pbVar6 = (pointer)(long)(int)((ulong)((long)local_88.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_88.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
        } while (lVar7 < (long)pbVar6);
      }
      pbVar5 = local_60 + 1;
    } while (pbVar5 != local_68);
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return -1;
}

Assistant:

int findCloseStringMatch(
        const stringVector& testStrings,
        const stringVector& inputStrings,
        string_match_type matchType)
    {
        std::string lct;  // lower case test string
        std::string lcis;  // lower case input string
        stringVector lciStrings = inputStrings;
        // make all the input strings lower case
        for (auto& str : lciStrings) {
            makeLowerCase(str);
        }
        for (const auto& testStr : testStrings) {
            lct = convertToLowerCase(testStr);
            for (int kk = 0; kk < static_cast<int>(lciStrings.size()); ++kk) {
                lcis = lciStrings[kk];
                if (checkForMatch(lct, lcis, matchType)) {
                    return kk;
                }
            }
        }
        return -1;
    }